

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O3

ostream * lf::io::operator<<(ostream *stream,GMshFileV2 *mf)

{
  pointer pPVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer puVar4;
  ostream *poVar5;
  PhysicalEntity *pe;
  pointer pPVar6;
  char *pcVar7;
  Element *e;
  pointer pEVar8;
  pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *n;
  pointer ppVar9;
  pointer ppVar10;
  pointer puVar11;
  Matrix<double,_3,_1,_0,_3,_1> *local_58;
  char local_49;
  GMshFileV2 *local_48;
  pointer local_40;
  ostream *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"GMSH FILE: Ver. ",0x10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(mf->VersionNumber)._M_dataplus._M_p,
                      (mf->VersionNumber)._M_string_length);
  pcVar7 = "(Text)";
  if (mf->IsBinary != false) {
    pcVar7 = "(Binary)";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar7,(ulong)mf->IsBinary * 2 + 6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", size of double = ",0x13);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,mf->DoubleSize);
  local_58._0_1_ = (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"=======================================================",0x37);
  local_58._0_1_ = (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"PHYSICAL ENTITIES (Dimension, Number, Name):",0x2c);
  local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  pPVar1 = (mf->PhysicalEntities).
           super__Vector_base<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = mf;
  for (pPVar6 = (mf->PhysicalEntities).
                super__Vector_base<lf::io::GMshFileV2::PhysicalEntity,_std::allocator<lf::io::GMshFileV2::PhysicalEntity>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar6 != pPVar1; pPVar6 = pPVar6 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"  ",2);
    poVar5 = (ostream *)std::ostream::operator<<(stream,pPVar6->Dimension);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t , ",4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar6->Number);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t , ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pPVar6->Name)._M_dataplus._M_p,(pPVar6->Name)._M_string_length);
    local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"NODES (Number, coords)",0x16);
  local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  ppVar9 = (local_48->Nodes).
           super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (local_48->Nodes).
           super__Vector_base<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_int,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar9 != ppVar2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"  ",2);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t , ",4);
      local_58 = &ppVar9->second;
      poVar5 = Eigen::operator<<(poVar5,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                         *)&local_58);
      local_49 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_49,1);
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,
             "ELEMENTS (Number, Type, PhysicalEntity Nr, ElementaryEntityNr, Mesh partitions to which it belongs, Node numbers in it)"
             ,0x77);
  local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  pEVar8 = (local_48->Elements).
           super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (local_48->Elements).
             super__Vector_base<lf::io::GMshFileV2::Element,_std::allocator<lf::io::GMshFileV2::Element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar8 != local_40) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"  ",2);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t ",2);
      operator<<(poVar5,pEVar8->Type);
      local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,9);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pEVar8->PhysicalEntityNr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pEVar8->ElementaryEntityNr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t",1);
      ppVar3 = (((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)&(pEVar8->MeshPartitions).super__Vector_base<int,_std::allocator<int>_>)->
               _M_impl).super__Vector_impl_data._M_finish;
      for (ppVar10 = (((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        *)&(pEVar8->MeshPartitions).super__Vector_base<int,_std::allocator<int>_>)->
                     _M_impl).super__Vector_impl_data._M_start; ppVar10 != ppVar3;
          ppVar10 = (pointer)&ppVar10->second) {
        poVar5 = (ostream *)std::ostream::operator<<(stream,ppVar10->first);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      }
      local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,9);
      std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
      puVar4 = (pEVar8->NodeNumbers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar11 = (pEVar8->NodeNumbers).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar11 != puVar4; puVar11 = puVar11 + 1) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      }
      local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
      pEVar8 = pEVar8 + 1;
    } while (pEVar8 != local_40);
  }
  local_58._0_1_ = (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>)0xa;
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"PERIODIC ENTITIES:",0x12);
  local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
  local_38 = stream;
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_58,1);
  pEVar8 = (pointer)(local_48->Periodic).
                    super__Vector_base<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_48 = (GMshFileV2 *)
             (local_48->Periodic).
             super__Vector_base<lf::io::GMshFileV2::PeriodicEntity,_std::allocator<lf::io::GMshFileV2::PeriodicEntity>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if ((GMshFileV2 *)pEVar8 != local_48) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  dim=",6);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,pEVar8->Number);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", slaveNr=",10);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pEVar8->Type);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", masterNr=",0xb);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,pEVar8->PhysicalEntityNr);
      local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
      ppVar3 = (((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  *)&(pEVar8->MeshPartitions).super__Vector_base<int,_std::allocator<int>_>)->
               _M_impl).super__Vector_impl_data._M_finish;
      local_40 = pEVar8;
      for (ppVar10 = (((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        *)&(pEVar8->MeshPartitions).super__Vector_base<int,_std::allocator<int>_>)->
                     _M_impl).super__Vector_impl_data._M_start; ppVar10 != ppVar3;
          ppVar10 = ppVar10 + 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," <-> ",5);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        local_58 = (Matrix<double,_3,_1,_0,_3,_1> *)CONCAT71(local_58._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_58,1);
      }
      pEVar8 = (pointer)&local_40->NodeNumbers;
    } while ((GMshFileV2 *)pEVar8 != local_48);
  }
  return local_38;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const GMshFileV2& mf) {
  stream << "GMSH FILE: Ver. " << mf.VersionNumber
         << (mf.IsBinary ? "(Binary)" : "(Text)")
         << ", size of double = " << mf.DoubleSize << '\n';
  stream << "=======================================================" << '\n';
  stream << "PHYSICAL ENTITIES (Dimension, Number, Name):" << '\n';
  for (const auto& pe : mf.PhysicalEntities) {
    stream << "  " << pe.Dimension << "\t , " << pe.Number << "\t , " << pe.Name
           << '\n';
  }
  stream << "NODES (Number, coords)" << '\n';
  for (const auto& n : mf.Nodes) {
    stream << "  " << n.first << "\t , " << n.second.transpose() << '\n';
  }
  stream << "ELEMENTS (Number, Type, PhysicalEntity Nr, ElementaryEntityNr, "
            "Mesh partitions to which it belongs, Node numbers in it)"
         << '\n';
  for (const auto& e : mf.Elements) {
    stream << "  " << e.Number << "\t " << e.Type << '\t' << e.PhysicalEntityNr
           << "\t" << e.ElementaryEntityNr << "\t";
    for (auto p : e.MeshPartitions) {
      stream << p << ", ";
    }
    stream << '\t';
    for (auto n : e.NodeNumbers) {
      stream << n << ", ";
    }
    stream << '\n';
  }
  stream << '\n';
  stream << "PERIODIC ENTITIES:" << '\n';
  for (const auto& pe : mf.Periodic) {
    std::cout << "  dim=" << pe.Dimension
              << ", slaveNr=" << pe.ElementarySlaveNr
              << ", masterNr=" << pe.ElementaryMasterNr << '\n';
    for (auto nm : pe.NodeMapping) {
      std::cout << "    " << nm.first << " <-> " << nm.second << '\n';
    }
  }
  return stream;
}